

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_function_args_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,TextureFunctionArguments *args,
          bool *p_forward)

{
  uint32_t id;
  uint32_t uVar1;
  Dim DVar2;
  uint id_00;
  SPIRType *type;
  string *psVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  SPIRType *pSVar7;
  char *pcVar8;
  long *plVar9;
  undefined8 *puVar10;
  runtime_error *this_00;
  size_type *psVar11;
  byte bVar12;
  CompilerGLSL *pCVar13;
  _Alloc_hider _Var14;
  string *in_R8;
  char (*in_R9) [2];
  char *pcVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> coord_expr;
  SPIRType expected_type;
  char (*in_stack_fffffffffffffdf8) [4];
  string local_1f0;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [20];
  uint32_t uStack_17c;
  undefined8 uStack_178;
  uint *local_170;
  size_t local_168;
  uint local_158 [8];
  bool *local_138;
  size_t local_130;
  bool local_120 [24];
  TypedID<(spirv_cross::Types)1> *local_108;
  size_t local_100;
  TypedID<(spirv_cross::Types)1> local_f0 [8];
  uint *local_d0;
  size_t local_c8;
  uint local_b8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  bool *local_38;
  
  id = (args->base).img.id;
  type = (args->base).imgtype;
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = p_forward;
  if ((args->base).is_fetch == true) {
    convert_separate_image_to_expression_abi_cxx11_((string *)local_190,this,id);
  }
  else {
    to_non_uniform_aware_expression_abi_cxx11_((string *)local_190,this,id);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_190);
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_);
  }
  if ((args->nonuniform_expression == true) &&
     (lVar6 = ::std::__cxx11::string::find((char)__return_storage_ptr__,0x5b), lVar6 != -1)) {
    in_R8 = (string *)0x3452a8;
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              ((string *)local_190,(spirv_cross *)&(this->backend).nonuniform_qualifier,
               (char **)0x35c56f,(char (*) [2])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_190);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  bVar5 = (this->backend).swizzle_is_function;
  bVar4 = should_forward(this,args->coord);
  uVar1 = args->coord_components;
  pSVar7 = Compiler::expression_type(&this->super_Compiler,args->coord);
  pcVar15 = "";
  if (uVar1 != pSVar7->vecsize) {
    if (uVar1 == 1) {
      pcVar15 = ".x";
    }
    else {
      if (uVar1 == 3) {
        pcVar8 = ".xyz()";
        pcVar15 = ".xyz";
      }
      else {
        if (uVar1 != 2) goto LAB_001f4f79;
        pcVar8 = ".xy()";
        pcVar15 = ".xy";
      }
      if (bVar5 != false) {
        pcVar15 = pcVar8;
      }
    }
  }
LAB_001f4f79:
  if (*pcVar15 == '\0') {
    to_expression_abi_cxx11_(&local_1d0,this,args->coord,true);
  }
  else {
    to_enclosed_expression_abi_cxx11_((string *)local_190,this,args->coord,true);
    plVar9 = (long *)::std::__cxx11::string::append(local_190);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1d0.field_2._M_allocated_capacity = *psVar11;
      local_1d0.field_2._8_8_ = plVar9[3];
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *psVar11;
      local_1d0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1d0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  pSVar7 = Compiler::expression_type(&this->super_Compiler,args->coord);
  if (*(int *)&(pSVar7->super_IVariant).field_0xc == 8) {
    SPIRType::SPIRType((SPIRType *)local_190,pSVar7);
    uStack_17c = args->coord_components;
    local_190._12_4_ = 7;
    in_R8 = &local_1d0;
    bitcast_expression(&local_1f0,this,(SPIRType *)local_190,
                       *(BaseType *)&(pSVar7->super_IVariant).field_0xc,in_R8);
    ::std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    local_190._0_8_ = &PTR__SPIRType_003d5290;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_78);
    local_c8 = 0;
    if (local_d0 != local_b8) {
      free(local_d0);
    }
    local_100 = 0;
    if (local_108 != local_f0) {
      free(local_108);
    }
    local_130 = 0;
    if (local_138 != local_120) {
      free(local_138);
    }
    local_168 = 0;
    if (local_170 != local_158) {
      free(local_170);
    }
  }
  DVar2 = (type->image).dim;
  if (((byte)(DVar2 == DimCube | DVar2 == Dim2D & (type->image).arrayed) == 1) &&
     (bVar5 = Compiler::is_depth_image(&this->super_Compiler,type,id), bVar5 && args->lod != 0)) {
    bVar12 = (args->base).is_fetch ^ 1;
  }
  else {
    bVar12 = 0;
  }
  id_00 = args->dref;
  pCVar13 = (CompilerGLSL *)(ulong)id_00;
  if (id_00 == 0) {
    if (((type->image).dim == Dim1D) && ((this->options).es == true)) {
      bVar5 = (type->image).arrayed;
      if (*(int *)&(pSVar7->super_IVariant).field_0xc - 0xcU < 3) {
        if ((bVar5 != false) || ((args->base).is_proj == true)) {
          enclose_expression(&local_1f0,pCVar13,&local_1d0);
          enclose_expression(&local_1b0,pCVar13,&local_1d0);
          join<char_const(&)[6],std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[4]>
                    ((string *)local_190,(spirv_cross *)0x341fcc,(char (*) [6])&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ".x, 0.0, ",(char (*) [10])&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x349e72,
                     in_stack_fffffffffffffdf8);
          goto LAB_001f5651;
        }
        join<char_const(&)[6],std::__cxx11::string&,char_const(&)[7]>
                  ((string *)local_190,(spirv_cross *)0x343d59,(char (*) [6])&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", 0.0)",
                   (char (*) [7])in_R8);
LAB_001f59ac:
        ::std::__cxx11::string::operator=((string *)&local_1d0,(string *)local_190);
        psVar3 = (string *)local_190;
        _Var14._M_p = (pointer)local_190._0_8_;
      }
      else {
        if (bVar5 == false) {
          join<char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                    ((string *)local_190,(spirv_cross *)"ivec2(",(char (*) [7])&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x344159,
                     (char (*) [5])in_R8);
          goto LAB_001f59ac;
        }
        enclose_expression(&local_1f0,pCVar13,&local_1d0);
        enclose_expression(&local_1b0,pCVar13,&local_1d0);
        join<char_const(&)[7],std::__cxx11::string,char_const(&)[8],std::__cxx11::string,char_const(&)[4]>
                  ((string *)local_190,(spirv_cross *)"ivec3(",(char (*) [7])&local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".x, 0, ",
                   (char (*) [8])&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x349e72,
                   in_stack_fffffffffffffdf8);
LAB_001f5651:
        ::std::__cxx11::string::operator=((string *)&local_1d0,(string *)local_190);
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        psVar3 = &local_1f0;
        _Var14._M_p = local_1f0._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var14._M_p != &psVar3->field_2) {
        operator_delete(_Var14._M_p);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
  }
  else {
    if (bVar4) {
      bVar4 = should_forward(this,id_00);
    }
    else {
      bVar4 = false;
    }
    if (((args->base).is_gather == false) && (args->coord_components != 4)) {
      if ((args->base).is_proj != true) {
        pSVar7 = Compiler::expression_type(&this->super_Compiler,args->coord);
        SPIRType::SPIRType((SPIRType *)local_190,pSVar7);
        uStack_17c = args->coord_components + 1;
        if (((type->image).dim == Dim1D) && ((this->options).es == true)) {
          uStack_17c = args->coord_components + 2;
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        type_to_glsl_constructor_abi_cxx11_(&local_1f0,this,(SPIRType *)local_190);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1f0._M_dataplus._M_p);
        paVar16 = &local_1f0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar16) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        pCVar13 = (CompilerGLSL *)0x35c56f;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (((type->image).dim == Dim1D) && ((this->options).es == true)) {
          if ((type->image).arrayed == true) {
            enclose_expression(&local_1b0,pCVar13,&local_1d0);
            plVar9 = (long *)::std::__cxx11::string::append((char *)&local_1b0);
            psVar11 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_1f0.field_2._M_allocated_capacity = *psVar11;
              local_1f0.field_2._8_8_ = plVar9[3];
              local_1f0._M_dataplus._M_p = (pointer)paVar16;
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar11;
              local_1f0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1f0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1f0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != paVar16) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p);
            }
            pCVar13 = (CompilerGLSL *)0x341fbc;
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            enclose_expression(&local_1b0,pCVar13,&local_1d0);
            puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1b0);
            psVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_1f0.field_2._M_allocated_capacity = *psVar11;
              local_1f0.field_2._8_8_ = puVar10[3];
              local_1f0._M_dataplus._M_p = (pointer)paVar16;
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar11;
              local_1f0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1f0._M_string_length = puVar10[1];
            *puVar10 = psVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1f0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != paVar16) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p);
            }
          }
          else {
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else {
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_(&local_1f0,this,args->dref,true);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1f0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar16) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_190._0_8_ = &PTR__SPIRType_003d5290;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_78);
        local_c8 = 0;
        if (local_d0 != local_b8) {
          free(local_d0);
        }
        local_100 = 0;
        if (local_108 != local_f0) {
          free(local_108);
        }
        local_130 = 0;
        if (local_138 != local_120) {
          free(local_138);
        }
        local_168 = 0;
        if (local_170 != local_158) {
          free(local_170);
        }
        goto LAB_001f59f4;
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      DVar2 = (type->image).dim;
      if (DVar2 == Dim2D) {
        to_enclosed_expression_abi_cxx11_(&local_1f0,this,args->coord,true);
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_1f0);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_190 + 0x10);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          unique0x10000e51 = *psVar11;
          uStack_178 = plVar9[3];
          local_190._0_8_ = paVar16;
        }
        else {
          unique0x00012000 = *psVar11;
          local_190._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar9;
        }
        local_190._8_8_ = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._0_8_ != paVar16) {
          operator_delete((void *)local_190._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_((string *)local_190,this,args->dref,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._0_8_ != paVar16) {
          operator_delete((void *)local_190._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_enclosed_expression_abi_cxx11_(&local_1f0,this,args->coord,true);
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_1f0);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          unique0x10000e91 = *psVar11;
          uStack_178 = plVar9[3];
          local_190._0_8_ = paVar16;
        }
        else {
          unique0x00012000 = *psVar11;
          local_190._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar9;
        }
        local_190._8_8_ = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
      }
      else {
        if (DVar2 != Dim1D) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_190._0_8_ = local_190 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_190,"Invalid type for textureProj with shadow.","");
          ::std::runtime_error::runtime_error(this_00,(string *)local_190);
          *(undefined ***)this_00 = &PTR__runtime_error_003d4e98;
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        to_enclosed_expression_abi_cxx11_(&local_1f0,this,args->coord,true);
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_1f0);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_190 + 0x10);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          unique0x10000e71 = *psVar11;
          uStack_178 = plVar9[3];
          local_190._0_8_ = paVar16;
        }
        else {
          unique0x00012000 = *psVar11;
          local_190._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar9;
        }
        local_190._8_8_ = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._0_8_ != paVar16) {
          operator_delete((void *)local_190._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_((string *)local_190,this,args->dref,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._0_8_ != paVar16) {
          operator_delete((void *)local_190._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_enclosed_expression_abi_cxx11_(&local_1f0,this,args->coord,true);
        puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1f0);
        psVar11 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          unique0x10000eb1 = *psVar11;
          uStack_178 = puVar10[3];
          local_190._0_8_ = paVar16;
        }
        else {
          unique0x00012000 = *psVar11;
          local_190._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar10;
        }
        local_190._8_8_ = puVar10[1];
        *puVar10 = psVar11;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
      }
      paVar16 = &local_1f0.field_2;
      _Var14._M_p = local_1f0._M_dataplus._M_p;
      if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
        operator_delete((void *)local_190._0_8_);
        _Var14._M_p = local_1f0._M_dataplus._M_p;
      }
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)local_190,this,args->coord,true);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_190 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._0_8_ != paVar16) {
        operator_delete((void *)local_190._0_8_);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)local_190,this,args->dref,true);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
      _Var14._M_p = (pointer)local_190._0_8_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var14._M_p != paVar16) {
      operator_delete(_Var14._M_p);
    }
  }
LAB_001f59f4:
  if (args->grad_y != 0 || args->grad_x != 0) {
    if ((bVar4 == false) || (bVar5 = should_forward(this,args->grad_x), !bVar5)) {
      bVar4 = false;
    }
    else {
      bVar4 = should_forward(this,args->grad_y);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_190,this,args->grad_x,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_190,this,args->grad_y,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  if (args->lod == 0) {
    if ((((args->base).is_fetch == true) && ((type->image).dim != DimBuffer)) &&
       ((type->image).ms == false)) {
LAB_001f5bd7:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else if (bVar12 == 0) {
    if (bVar4 == false) {
      bVar4 = false;
    }
    else {
      bVar4 = should_forward(this,args->lod);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((((args->base).is_fetch == true) && ((type->image).dim != DimBuffer)) &&
       ((type->image).ms == false)) {
      bitcast_expression_abi_cxx11_((string *)local_190,this,Int,args->lod);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
    }
    else {
      to_expression_abi_cxx11_((string *)local_190,this,args->lod,true);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
    }
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  else {
    DVar2 = (type->image).dim;
    if ((DVar2 == Dim2D) || (DVar2 == DimCube)) goto LAB_001f5bd7;
  }
  if (args->coffset == 0) {
    if (args->offset == 0) goto LAB_001f5cbd;
    if (bVar4 == false) {
      bVar4 = false;
    }
    else {
      bVar4 = should_forward(this,args->offset);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bitcast_expression_abi_cxx11_((string *)local_190,this,Int,args->offset);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
  }
  else {
    if (bVar4 == false) {
      bVar4 = false;
    }
    else {
      bVar4 = should_forward(this,args->coffset);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bitcast_expression_abi_cxx11_((string *)local_190,this,Int,args->coffset);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
  }
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_);
  }
LAB_001f5cbd:
  if (args->sample != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bitcast_expression_abi_cxx11_((string *)local_190,this,Int,args->sample);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  if (args->min_lod != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_190,this,args->min_lod,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  if (args->sparse_texel != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_190,this,args->sparse_texel,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  if (args->bias != 0) {
    if (bVar4 == false) {
      bVar4 = false;
    }
    else {
      bVar4 = should_forward(this,args->bias);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_190,this,args->bias,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  if ((args->component != 0) && (bVar5 = expression_is_constant_null(this,args->component), !bVar5))
  {
    if (bVar4 == false) {
      bVar4 = false;
    }
    else {
      bVar4 = should_forward(this,args->component);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bitcast_expression_abi_cxx11_((string *)local_190,this,Int,args->component);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_190._0_8_);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  *local_38 = bVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	string farg_str;
	if (args.base.is_fetch)
		farg_str = convert_separate_image_to_expression(img);
	else
		farg_str = to_non_uniform_aware_expression(img);

	if (args.nonuniform_expression && farg_str.find_first_of('[') != string::npos)
	{
		// Only emit nonuniformEXT() wrapper if the underlying expression is arrayed in some way.
		farg_str = join(backend.nonuniform_qualifier, "(", farg_str, ")");
	}

	bool swizz_func = backend.swizzle_is_function;
	auto swizzle = [swizz_func](uint32_t comps, uint32_t in_comps) -> const char * {
		if (comps == in_comps)
			return "";

		switch (comps)
		{
		case 1:
			return ".x";
		case 2:
			return swizz_func ? ".xy()" : ".xy";
		case 3:
			return swizz_func ? ".xyz()" : ".xyz";
		default:
			return "";
		}
	};

	bool forward = should_forward(args.coord);

	// The IR can give us more components than we need, so chop them off as needed.
	auto swizzle_expr = swizzle(args.coord_components, expression_type(args.coord).vecsize);
	// Only enclose the UV expression if needed.
	auto coord_expr =
	    (*swizzle_expr == '\0') ? to_expression(args.coord) : (to_enclosed_expression(args.coord) + swizzle_expr);

	// texelFetch only takes int, not uint.
	auto &coord_type = expression_type(args.coord);
	if (coord_type.basetype == SPIRType::UInt)
	{
		auto expected_type = coord_type;
		expected_type.vecsize = args.coord_components;
		expected_type.basetype = SPIRType::Int;
		coord_expr = bitcast_expression(expected_type, coord_type.basetype, coord_expr);
	}

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad =
	    ((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    is_depth_image(imgtype, img) && args.lod != 0 && !args.base.is_fetch;

	if (args.dref)
	{
		forward = forward && should_forward(args.dref);

		// SPIR-V splits dref and coordinate.
		if (args.base.is_gather ||
		    args.coord_components == 4) // GLSL also splits the arguments in two. Same for textureGather.
		{
			farg_str += ", ";
			farg_str += to_expression(args.coord);
			farg_str += ", ";
			farg_str += to_expression(args.dref);
		}
		else if (args.base.is_proj)
		{
			// Have to reshuffle so we get vec4(coord, dref, proj), special case.
			// Other shading languages splits up the arguments for coord and compare value like SPIR-V.
			// The coordinate type for textureProj shadow is always vec4 even for sampler1DShadow.
			farg_str += ", vec4(";

			if (imgtype.image.dim == Dim1D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + ".x";
				farg_str += ", ";
				farg_str += "0.0, ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".y)";
			}
			else if (imgtype.image.dim == Dim2D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + (swizz_func ? ".xy()" : ".xy");
				farg_str += ", ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".z)";
			}
			else
				SPIRV_CROSS_THROW("Invalid type for textureProj with shadow.");
		}
		else
		{
			// Create a composite which merges coord/dref into a single vector.
			auto type = expression_type(args.coord);
			type.vecsize = args.coord_components + 1;
			if (imgtype.image.dim == Dim1D && options.es)
				type.vecsize++;
			farg_str += ", ";
			farg_str += type_to_glsl_constructor(type);
			farg_str += "(";

			if (imgtype.image.dim == Dim1D && options.es)
			{
				if (imgtype.image.arrayed)
				{
					farg_str += enclose_expression(coord_expr) + ".x";
					farg_str += ", 0.0, ";
					farg_str += enclose_expression(coord_expr) + ".y";
				}
				else
				{
					farg_str += coord_expr;
					farg_str += ", 0.0";
				}
			}
			else
				farg_str += coord_expr;

			farg_str += ", ";
			farg_str += to_expression(args.dref);
			farg_str += ")";
		}
	}
	else
	{
		if (imgtype.image.dim == Dim1D && options.es)
		{
			// Have to fake a second coordinate.
			if (type_is_floating_point(coord_type))
			{
				// Cannot mix proj and array.
				if (imgtype.image.arrayed || args.base.is_proj)
				{
					coord_expr = join("vec3(", enclose_expression(coord_expr), ".x, 0.0, ",
					                  enclose_expression(coord_expr), ".y)");
				}
				else
					coord_expr = join("vec2(", coord_expr, ", 0.0)");
			}
			else
			{
				if (imgtype.image.arrayed)
				{
					coord_expr = join("ivec3(", enclose_expression(coord_expr),
									  ".x, 0, ",
									  enclose_expression(coord_expr), ".y)");
				}
				else
					coord_expr = join("ivec2(", coord_expr, ", 0)");
			}
		}

		farg_str += ", ";
		farg_str += coord_expr;
	}

	if (args.grad_x || args.grad_y)
	{
		forward = forward && should_forward(args.grad_x);
		forward = forward && should_forward(args.grad_y);
		farg_str += ", ";
		farg_str += to_expression(args.grad_x);
		farg_str += ", ";
		farg_str += to_expression(args.grad_y);
	}

	if (args.lod)
	{
		if (workaround_lod_array_shadow_as_grad)
		{
			// Implement textureGrad() instead. LOD == 0.0 is implemented as gradient of 0.0.
			// Implementing this as plain texture() is not safe on some implementations.
			if (imgtype.image.dim == Dim2D)
				farg_str += ", vec2(0.0), vec2(0.0)";
			else if (imgtype.image.dim == DimCube)
				farg_str += ", vec3(0.0), vec3(0.0)";
		}
		else
		{
			forward = forward && should_forward(args.lod);
			farg_str += ", ";

			// Lod expression for TexelFetch in GLSL must be int, and only int.
			if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
				farg_str += bitcast_expression(SPIRType::Int, args.lod);
			else
				farg_str += to_expression(args.lod);
		}
	}
	else if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		farg_str += ", 0";
	}

	if (args.coffset)
	{
		forward = forward && should_forward(args.coffset);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.coffset);
	}
	else if (args.offset)
	{
		forward = forward && should_forward(args.offset);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.offset);
	}

	if (args.sample)
	{
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.sample);
	}

	if (args.min_lod)
	{
		farg_str += ", ";
		farg_str += to_expression(args.min_lod);
	}

	if (args.sparse_texel)
	{
		// Sparse texel output parameter comes after everything else, except it's before the optional, component/bias arguments.
		farg_str += ", ";
		farg_str += to_expression(args.sparse_texel);
	}

	if (args.bias)
	{
		forward = forward && should_forward(args.bias);
		farg_str += ", ";
		farg_str += to_expression(args.bias);
	}

	if (args.component && !expression_is_constant_null(args.component))
	{
		forward = forward && should_forward(args.component);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.component);
	}

	*p_forward = forward;

	return farg_str;
}